

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937sampler.hpp
# Opt level: O1

vec3f __thiscall MT19937Sampler::sampleUnitSphereSurface(MT19937Sampler *this)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vec3f vVar6;
  
  do {
    do {
      (**(this->super_Sampler)._vptr_Sampler)(this);
      (**(this->super_Sampler)._vptr_Sampler)(this);
      fVar3 = extraout_XMM0_Da + extraout_XMM0_Da + -1.0;
      fVar4 = extraout_XMM0_Da_00 + extraout_XMM0_Da_00 + -1.0;
      (**(this->super_Sampler)._vptr_Sampler)(this);
      fVar1 = extraout_XMM0_Da_01 + extraout_XMM0_Da_01 + -1.0;
      fVar5 = fVar1 * fVar1 + fVar3 * fVar3 + fVar4 * fVar4;
      if (fVar5 < 0.0) {
        fVar2 = sqrtf(fVar5);
      }
      else {
        fVar2 = SQRT(fVar5);
      }
    } while (1.0 < fVar2);
    if (fVar5 < 0.0) {
      fVar2 = sqrtf(fVar5);
    }
    else {
      fVar2 = SQRT(fVar5);
    }
  } while (fVar2 < 0.001);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  vVar6.z = fVar1 * fVar5;
  vVar6.x = fVar3 * fVar5;
  vVar6.y = fVar4 * fVar5;
  return vVar6;
}

Assistant:

vec3f sampleUnitSphereSurface() {
		// TODO optimize
		vec3f v;
		do v = vec3f(get1f()*2-1, get1f()*2-1, get1f()*2-1);
		while (norm(v)>1 || norm(v)<1e-3);
		return normalized(v);
	}